

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minpack.cc
# Opt level: O2

bool gmath::slmder(lmderFct fct,int m,int n,double *x,double *fvec,void *up,double tol,long *ltmp,
                  double *dtmp)

{
  long lVar1;
  size_t __nmemb;
  doublereal *local_c0;
  integer *local_b8;
  integer ldfjacl;
  integer njevl;
  integer nfevl;
  integer info;
  integer nprint;
  doublereal factor;
  integer model;
  integer maxfevl;
  doublereal gtol;
  doublereal xtol;
  doublereal ftol;
  integer np;
  integer mp;
  
  ldfjacl = (integer)m;
  __nmemb = (size_t)n;
  gtol = 0.0;
  nprint = -1;
  maxfevl = (integer)(n * 200 + 200);
  info = 0;
  nfevl = 0;
  model = 1;
  njevl = 0;
  factor = 100.0;
  xtol = tol;
  ftol = tol;
  np = __nmemb;
  mp = ldfjacl;
  if (ltmp == (long *)0x0) {
    ltmp = (long *)calloc(__nmemb,8);
    local_b8 = ltmp;
  }
  else {
    local_b8 = (integer *)0x0;
  }
  if (dtmp == (double *)0x0) {
    dtmp = (double *)calloc((long)(n * 5 + m),8);
    local_c0 = dtmp;
  }
  else {
    local_c0 = (doublereal *)0x0;
  }
  lVar1 = (long)(m * n);
  lmder_cvkit((S_fp)fct,&mp,&np,x,fvec,dtmp + __nmemb,&ldfjacl,&ftol,&xtol,&gtol,&maxfevl,dtmp,
              &model,&factor,&nprint,&info,&nfevl,&njevl,ltmp,dtmp + __nmemb + lVar1,
              dtmp + n * 2 + lVar1,dtmp + n * 3 + lVar1,dtmp + (n << 2) + lVar1,dtmp + n * 5 + lVar1
              ,up);
  free(local_b8);
  free(local_c0);
  return info < 5;
}

Assistant:

bool slmder(lmderFct fct, int m, int n, double x[], double fvec[], void *up,
            double tol, long ltmp[], double dtmp[])
{
  integer    mp=static_cast<integer>(m);
  integer    np=static_cast<integer>(n);
  doublereal ftol=tol, xtol=tol, gtol=0;
  integer    maxfevl=static_cast<integer>(200*(n+1));
  integer    model=1;
  doublereal factor=100;
  integer    nprint=-1;
  integer    info=0;
  integer    nfevl=0, njevl=0;
  integer    ldfjacl=(integer) m;

  long       *altmp=0;
  double     *adtmp=0;

  if (ltmp == 0)
  {
    ltmp=altmp=static_cast<long *>(calloc(n, sizeof(long)));
  }

  if (dtmp == NULL)
  {
    dtmp=adtmp=static_cast<double *>(calloc(5*n+m, sizeof(double)));
  }

  lmder_cvkit(reinterpret_cast<S_fp>(fct), &mp, &np, x, fvec, dtmp+n, &ldfjacl, &ftol, &xtol, &gtol,
              &maxfevl, dtmp, &model, &factor, &nprint, &info, &nfevl, &njevl, ltmp,
              dtmp+n+m*n, dtmp+2*n+m*n, dtmp+3*n+m*n, dtmp+4*n+m*n, dtmp+5*n+m*n, up);

  free(altmp);
  free(adtmp);

  assert(info >= 1);

  return info <= 4;
}